

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureHeartBeatInterval_TestRequestNotNeeded_HeartbeatGeneratedHelper::
~initiatorFixtureHeartBeatInterval_TestRequestNotNeeded_HeartbeatGeneratedHelper
          (initiatorFixtureHeartBeatInterval_TestRequestNotNeeded_HeartbeatGeneratedHelper *this)

{
  ~initiatorFixtureHeartBeatInterval_TestRequestNotNeeded_HeartbeatGeneratedHelper
            ((initiatorFixtureHeartBeatInterval_TestRequestNotNeeded_HeartbeatGeneratedHelper *)
             &this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, HeartBeatInterval_TestRequestNotNeeded_HeartbeatGenerated) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(2, 0, 31);

  UtcTimeStamp time;

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  //Force Heartbeat Interval Flow
  process_sleep(2);

  object->next();
  CHECK_EQUAL(4, object->getExpectedSenderNum());
  CHECK(object->isLoggedOn());

}